

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O0

parser_error parse_player_timed_fail(parser *p)

{
  int iVar1;
  errr eVar2;
  undefined8 *puVar3;
  bool bVar4;
  int local_38;
  uint local_34;
  wchar_t idx;
  wchar_t code;
  timed_failure *f;
  char *name;
  timed_effect_parse_state *ps;
  parser *p_local;
  
  ps = (timed_effect_parse_state *)p;
  name = (char *)parser_priv(p);
  f = (timed_failure *)parser_getstr((parser *)ps,"flag");
  if (name == (char *)0x0) {
    __assert_fail("ps",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                  ,0xbd,"enum parser_error parse_player_timed_fail(struct parser *)");
  }
  if (*(long *)name == 0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    local_34 = parser_getuint((parser *)ps,"code");
    switch(local_34) {
    case 1:
      local_38 = lookup_flag(list_obj_flag_names,(char *)f);
      if (local_38 == 0) {
        return PARSE_ERROR_INVALID_FLAG;
      }
      break;
    case 2:
    case 3:
      local_38 = 0;
      while( true ) {
        bVar4 = false;
        if (list_element_names[local_38] != (char *)0x0) {
          iVar1 = strcmp(list_element_names[local_38],(char *)f);
          bVar4 = iVar1 != 0;
        }
        if (!bVar4) break;
        local_38 = local_38 + 1;
      }
      if (local_38 == 0x1c) {
        return PARSE_ERROR_INVALID_FLAG;
      }
      break;
    case 4:
      local_38 = lookup_flag(list_player_flag_names,(char *)f);
      if (local_38 == 0) {
        return PARSE_ERROR_INVALID_FLAG;
      }
      break;
    case 5:
      eVar2 = grab_name("timed effect",(char *)f,list_timed_effect_names,0x36,&local_38);
      if (eVar2 != 0) {
        return PARSE_ERROR_INVALID_FLAG;
      }
      break;
    default:
      return PARSE_ERROR_INVALID_FLAG;
    }
    puVar3 = (undefined8 *)mem_alloc(0x10);
    *puVar3 = *(undefined8 *)(*(long *)name + 0x38);
    *(uint *)(puVar3 + 1) = local_34;
    *(int *)((long)puVar3 + 0xc) = local_38;
    *(undefined8 **)(*(long *)name + 0x38) = puVar3;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_player_timed_fail(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);
	const char *name = parser_getstr(p, "flag");
	struct timed_failure *f;
	int code, idx;

	assert(ps);
	if (!ps->t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}

	code = parser_getuint(p, "code");
	switch (code) {
	case TMD_FAIL_FLAG_OBJECT:
		idx = lookup_flag(list_obj_flag_names, name);
		if (idx == FLAG_END) {
			return PARSE_ERROR_INVALID_FLAG;
		}
		break;

	case TMD_FAIL_FLAG_PLAYER:
		idx = lookup_flag(list_player_flag_names, name);
		if (idx == FLAG_END) {
			return PARSE_ERROR_INVALID_FLAG;
		}
		break;

	case TMD_FAIL_FLAG_RESIST:
	case TMD_FAIL_FLAG_VULN:
		idx = 0;
		while (list_element_names[idx]
				&& !streq(list_element_names[idx], name)) {
			idx++;
		}
		if (idx == ELEM_MAX) {
			return PARSE_ERROR_INVALID_FLAG;
		}
		break;

	case TMD_FAIL_FLAG_TIMED_EFFECT:
		if (grab_name("timed effect", name,
				list_timed_effect_names,
				N_ELEMENTS(list_timed_effect_names),
				&idx)) {
			return PARSE_ERROR_INVALID_FLAG;
		}
		break;

	default:
		return PARSE_ERROR_INVALID_FLAG;
	}

	f = mem_alloc(sizeof(*f));
	f->next = ps->t->fail;
	f->code = code;
	f->idx = idx;
	ps->t->fail = f;

	return PARSE_ERROR_NONE;
}